

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O3

uint32_t __thiscall BufferedReader::getReaderCount(BufferedReader *this)

{
  size_t sVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_readersMtx);
  if (iVar2 == 0) {
    sVar1 = (this->m_readers)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_readersMtx);
    return (uint32_t)sVar1;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

uint32_t BufferedReader::getReaderCount()
{
    std::lock_guard lock(m_readersMtx);
    return static_cast<uint32_t>(m_readers.size());
}